

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgPort.c
# Opt level: O3

uint waitForDsrNE(uchar mask,uchar bitVal,ulong ms)

{
  byte bVar1;
  int iVar2;
  longlong timer;
  
  timer = tmrReadTimer();
  do {
    bVar1 = in((undefined2)ZvgIO.ecpDsr);
    if (((bVar1 ^ bitVal) & mask) != 0) {
      return (uint)(byte)(bVar1 + 0x80);
    }
    iVar2 = tmrTestMillis(timer,(int)ms);
  } while (iVar2 == 0);
  return 0xffffffff;
}

Assistant:

static uint	waitForDsrNE( uchar mask, uchar bitVal, ulong ms)
{
	uchar		testVal;
	uchar		readVal;
	long long int		timer;
	bool		foundF;

	testVal = ( bitVal ^ DSR_InvMask) & mask;
	foundF = zFalse;
	//tmrReadTimer(&timer);
	timer = tmrReadTimer();
	do
	{
		if (((readVal = inportb( ZvgIO.ecpDsr)) & mask) != testVal)
		{	foundF = zTrue;
			break;
		}
	} while (!tmrTestMillis( timer, ms));

	if (!foundF)
		return (ZVG_TIMEOUT);

	return (readVal ^ DSR_InvMask);
}